

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O0

void __thiscall slang::ast::PortConnection::checkSimulatedNetTypes(PortConnection *this)

{
  SourceRange *pSVar1;
  string_view *psVar2;
  NetType *this_00;
  NetType *this_01;
  string_view arg;
  string_view arg_00;
  vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>_>_>
  *pvVar3;
  iterator pNVar4;
  bool bVar5;
  PortSymbol *this_02;
  MultiPortSymbol *pMVar6;
  iterator ppPVar7;
  size_type sVar8;
  reference pNVar9;
  Symbol *pSVar10;
  Diagnostic *pDVar11;
  Type *this_03;
  Diagnostic *this_04;
  iterator pNVar12;
  iterator pNVar13;
  uint arg_01;
  Diagnostic *diag_2;
  bitwidth_t right;
  bitwidth_t left;
  bitwidth_t width;
  NetType *exNt_1;
  NetType *inNt_1;
  bitwidth_t local_220;
  bool shouldWarn_1;
  uint uStack_21c;
  bool shownDeclaredHere;
  bitwidth_t exprWidth;
  bitwidth_t currBit;
  iterator ex;
  iterator in;
  undefined4 local_1fc;
  size_t local_1f8;
  char *pcStack_1f0;
  pointer local_1e8;
  pointer pvStack_1e0;
  SourceLocation local_1d8;
  SourceLocation SStack_1d0;
  undefined4 local_1bc;
  Diagnostic *local_1b8;
  Diagnostic *diag_1;
  pointer pvStack_1a8;
  bool shouldWarn;
  pointer pvStack_1a0;
  size_t local_198;
  char *pcStack_190;
  SourceLocation local_188;
  SourceLocation SStack_180;
  undefined4 local_174;
  Diagnostic *local_170;
  Diagnostic *diag;
  NetType *exNt;
  NetType *inNt;
  anon_class_8_1_89926193 checker;
  NetType *udnt;
  anon_class_16_2_f87c7f41 requireMatching;
  Symbol *sym;
  Scope *scope;
  undefined1 local_f0 [8];
  SmallVector<slang::ast::PortSymbol::NetTypeRange,_4UL> external;
  PortSymbol *p;
  iterator __end3;
  iterator __begin3;
  span<const_slang::ast::PortSymbol_*const,_18446744073709551615UL> *__range3;
  undefined1 local_68 [8];
  SmallVector<slang::ast::PortSymbol::NetTypeRange,_4UL> internal;
  PortConnection *this_local;
  
  internal.stackBase._40_8_ = this;
  getExpression(this);
  if ((this->expr != (Expression *)0x0) && (bVar5 = Expression::bad(this->expr), !bVar5)) {
    SmallVector<slang::ast::PortSymbol::NetTypeRange,_4UL>::SmallVector
              ((SmallVector<slang::ast::PortSymbol::NetTypeRange,_4UL> *)local_68);
    if (this->port->kind == Port) {
      this_02 = Symbol::as<slang::ast::PortSymbol>(this->port);
      PortSymbol::getNetTypes
                (this_02,(SmallVectorBase<slang::ast::PortSymbol::NetTypeRange> *)local_68);
    }
    else {
      pMVar6 = Symbol::as<slang::ast::MultiPortSymbol>(this->port);
      __end3 = nonstd::span_lite::span<const_slang::ast::PortSymbol_*const,_18446744073709551615UL>
               ::begin(&pMVar6->ports);
      ppPVar7 = nonstd::span_lite::span<const_slang::ast::PortSymbol_*const,_18446744073709551615UL>
                ::end(&pMVar6->ports);
      for (; __end3 != ppPVar7; __end3 = __end3 + 1) {
        external.stackBase._40_8_ = *__end3;
        PortSymbol::getNetTypes
                  ((PortSymbol *)external.stackBase._40_8_,
                   (SmallVectorBase<slang::ast::PortSymbol::NetTypeRange> *)local_68);
      }
    }
    SmallVector<slang::ast::PortSymbol::NetTypeRange,_4UL>::SmallVector
              ((SmallVector<slang::ast::PortSymbol::NetTypeRange,_4UL> *)local_f0);
    getNetRanges(this->expr,(SmallVectorBase<slang::ast::PortSymbol::NetTypeRange> *)local_f0);
    bVar5 = SmallVectorBase<slang::ast::PortSymbol::NetTypeRange>::empty
                      ((SmallVectorBase<slang::ast::PortSymbol::NetTypeRange> *)local_68);
    if ((bVar5) &&
       (bVar5 = SmallVectorBase<slang::ast::PortSymbol::NetTypeRange>::empty
                          ((SmallVectorBase<slang::ast::PortSymbol::NetTypeRange> *)local_f0), bVar5
       )) {
      scope._4_4_ = 1;
    }
    else {
      sym = (Symbol *)Symbol::getParentScope((Symbol *)this->parentInstance);
      if (sym == (Symbol *)0x0) {
        assert::assertFailed
                  ("scope",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/symbols/PortSymbols.cpp"
                   ,0x739,"void slang::ast::PortConnection::checkSimulatedNetTypes() const");
      }
      sVar8 = SmallVectorBase<slang::ast::PortSymbol::NetTypeRange>::size
                        ((SmallVectorBase<slang::ast::PortSymbol::NetTypeRange> *)local_68);
      if (((sVar8 == 1) &&
          (pNVar9 = SmallVectorBase<slang::ast::PortSymbol::NetTypeRange>::operator[]
                              ((SmallVectorBase<slang::ast::PortSymbol::NetTypeRange> *)local_68,0),
          pNVar9->netType->netKind == Interconnect)) &&
         (pSVar10 = findAnyVars(this->expr), pSVar10 != (Symbol *)0x0)) {
        pDVar11 = Scope::addDiag((Scope *)sym,(DiagCode)0x3c0006,this->expr->sourceRange);
        requireMatching.scope = (Scope **)(pSVar10->name)._M_len;
        Diagnostic::operator<<(pDVar11,pSVar10->name);
        scope._4_4_ = 1;
      }
      else {
        requireMatching.this = (PortConnection *)&sym;
        udnt = (NetType *)this;
        bVar5 = SmallVectorBase<slang::ast::PortSymbol::NetTypeRange>::empty
                          ((SmallVectorBase<slang::ast::PortSymbol::NetTypeRange> *)local_68);
        if ((bVar5) ||
           (bVar5 = SmallVectorBase<slang::ast::PortSymbol::NetTypeRange>::empty
                              ((SmallVectorBase<slang::ast::PortSymbol::NetTypeRange> *)local_f0),
           bVar5)) {
          checker.udnt = (NetType **)0x0;
          inNt = (NetType *)&checker;
          const::$_0::operator()
                    ((__0 *)&inNt,(SmallVector<slang::ast::PortSymbol::NetTypeRange,_4UL> *)local_68
                    );
          const::$_0::operator()
                    ((__0 *)&inNt,(SmallVector<slang::ast::PortSymbol::NetTypeRange,_4UL> *)local_f0
                    );
          if (checker.udnt != (NetType **)0x0) {
            checkSimulatedNetTypes::anon_class_16_2_f87c7f41::operator()
                      ((anon_class_16_2_f87c7f41 *)&udnt,(NetType *)checker.udnt);
          }
          scope._4_4_ = 1;
        }
        else {
          sVar8 = SmallVectorBase<slang::ast::PortSymbol::NetTypeRange>::size
                            ((SmallVectorBase<slang::ast::PortSymbol::NetTypeRange> *)local_68);
          if ((sVar8 == 1) &&
             (sVar8 = SmallVectorBase<slang::ast::PortSymbol::NetTypeRange>::size
                                ((SmallVectorBase<slang::ast::PortSymbol::NetTypeRange> *)local_f0),
             sVar8 == 1)) {
            pNVar9 = SmallVectorBase<slang::ast::PortSymbol::NetTypeRange>::operator[]
                               ((SmallVectorBase<slang::ast::PortSymbol::NetTypeRange> *)local_68,0)
            ;
            exNt = pNVar9->netType;
            pNVar9 = SmallVectorBase<slang::ast::PortSymbol::NetTypeRange>::operator[]
                               ((SmallVectorBase<slang::ast::PortSymbol::NetTypeRange> *)local_f0,0)
            ;
            diag = (Diagnostic *)pNVar9->netType;
            if (exNt == (NetType *)diag) {
              scope._4_4_ = 1;
            }
            else {
              bVar5 = NetType::isBuiltIn(exNt);
              if ((bVar5) && (bVar5 = NetType::isBuiltIn((NetType *)diag), bVar5)) {
                NetType::getSimulatedNetType(exNt,(NetType *)diag,(bool *)((long)&diag_1 + 7));
                if ((diag_1._7_1_ & 1) != 0) {
                  local_1bc = 0xaf0006;
                  pSVar1 = &this->expr->sourceRange;
                  local_1d8 = pSVar1->startLoc;
                  SStack_1d0 = (this->expr->sourceRange).endLoc;
                  local_1b8 = Scope::addDiag((Scope *)sym,(DiagCode)0xaf0006,*pSVar1);
                  pvVar3 = &diag->args;
                  local_1e8 = (pvVar3->
                              super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish;
                  pvStack_1e0 = (diag->args).
                                super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage;
                  arg_00._M_len =
                       (size_t)(pvVar3->
                               super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish;
                  arg_00._M_str =
                       (char *)(pvVar3->
                               super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>_>_>
                               )._M_impl.super__Vector_impl_data._M_end_of_storage;
                  Diagnostic::operator<<(local_1b8,arg_00);
                  psVar2 = &(exNt->super_Symbol).name;
                  local_1f8 = psVar2->_M_len;
                  pcStack_1f0 = (exNt->super_Symbol).name._M_str;
                  Diagnostic::operator<<(local_1b8,*psVar2);
                  local_1fc = 0x40001;
                  in = *(iterator *)&this->port->location;
                  Diagnostic::addNote(local_1b8,(DiagCode)0x40001,(SourceLocation)in);
                }
              }
              else {
                bVar5 = NetType::isBuiltIn(exNt);
                if ((bVar5) || (bVar5 = NetType::isBuiltIn((NetType *)diag), bVar5)) {
                  bVar5 = NetType::isBuiltIn(exNt);
                  if (bVar5) {
                    checkSimulatedNetTypes::anon_class_16_2_f87c7f41::operator()
                              ((anon_class_16_2_f87c7f41 *)&udnt,(NetType *)diag);
                  }
                  else {
                    checkSimulatedNetTypes::anon_class_16_2_f87c7f41::operator()
                              ((anon_class_16_2_f87c7f41 *)&udnt,exNt);
                  }
                }
                else {
                  local_174 = 0x9b0006;
                  pSVar1 = &this->expr->sourceRange;
                  local_188 = pSVar1->startLoc;
                  SStack_180 = (this->expr->sourceRange).endLoc;
                  local_170 = Scope::addDiag((Scope *)sym,(DiagCode)0x9b0006,*pSVar1);
                  psVar2 = &(exNt->super_Symbol).name;
                  local_198 = psVar2->_M_len;
                  pcStack_190 = (exNt->super_Symbol).name._M_str;
                  pDVar11 = Diagnostic::operator<<(local_170,*psVar2);
                  pvVar3 = &diag->args;
                  pvStack_1a8 = (pvVar3->
                                super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish;
                  pvStack_1a0 = (diag->args).
                                super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage;
                  arg._M_len = (size_t)(pvVar3->
                                       super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>_>_>
                                       )._M_impl.super__Vector_impl_data._M_finish;
                  arg._M_str = (char *)(pvVar3->
                                       super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>_>_>
                                       )._M_impl.super__Vector_impl_data._M_end_of_storage;
                  Diagnostic::operator<<(pDVar11,arg);
                }
              }
              scope._4_4_ = 1;
            }
          }
          else {
            ex = SmallVectorBase<slang::ast::PortSymbol::NetTypeRange>::begin
                           ((SmallVectorBase<slang::ast::PortSymbol::NetTypeRange> *)local_68);
            _exprWidth = SmallVectorBase<slang::ast::PortSymbol::NetTypeRange>::begin
                                   ((SmallVectorBase<slang::ast::PortSymbol::NetTypeRange> *)
                                    local_f0);
            uStack_21c = 0;
            this_03 = not_null<const_slang::ast::Type_*>::operator->(&this->expr->type);
            local_220 = Type::getBitWidth(this_03);
            inNt_1._7_1_ = 0;
            while( true ) {
              this_00 = ex->netType;
              this_01 = _exprWidth->netType;
              bVar5 = NetType::isBuiltIn(this_00);
              if ((bVar5) && (bVar5 = NetType::isBuiltIn(this_01), bVar5)) {
                NetType::getSimulatedNetType(this_00,this_01,(bool *)((long)&inNt_1 + 6));
              }
              else {
                if (this_00 != this_01) {
                  pDVar11 = Scope::addDiag((Scope *)sym,(DiagCode)0x9a0006,this->expr->sourceRange);
                  pDVar11 = Diagnostic::operator<<(pDVar11,(this_00->super_Symbol).name);
                  Diagnostic::operator<<(pDVar11,(this_01->super_Symbol).name);
                  scope._4_4_ = 1;
                  goto LAB_002fbaf5;
                }
                inNt_1._6_1_ = 0;
              }
              if (ex->width < _exprWidth->width) {
                right = ex->width;
                _exprWidth->width = _exprWidth->width - right;
                ex = ex + 1;
              }
              else {
                right = _exprWidth->width;
                _exprWidth = _exprWidth + 1;
                if (ex->width == right) {
                  ex = ex + 1;
                }
                else {
                  ex->width = ex->width - right;
                }
              }
              if ((inNt_1._6_1_ & 1) != 0) {
                if (local_220 < uStack_21c + right) {
                  assert::assertFailed
                            ("exprWidth >= currBit + width",
                             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/symbols/PortSymbols.cpp"
                             ,0x7ce,
                             "void slang::ast::PortConnection::checkSimulatedNetTypes() const");
                }
                arg_01 = ~uStack_21c + local_220;
                pDVar11 = Scope::addDiag((Scope *)sym,(DiagCode)0xb00006,this->expr->sourceRange);
                Diagnostic::operator<<(pDVar11,(this_01->super_Symbol).name);
                this_04 = Diagnostic::operator<<(pDVar11,arg_01);
                Diagnostic::operator<<(this_04,(arg_01 - right) + 1);
                Diagnostic::operator<<(pDVar11,(this_00->super_Symbol).name);
                if ((inNt_1._7_1_ & 1) == 0) {
                  Diagnostic::addNote(pDVar11,(DiagCode)0x40001,this->port->location);
                  inNt_1._7_1_ = 1;
                }
              }
              pNVar13 = ex;
              pNVar12 = SmallVectorBase<slang::ast::PortSymbol::NetTypeRange>::end
                                  ((SmallVectorBase<slang::ast::PortSymbol::NetTypeRange> *)local_68
                                  );
              pNVar4 = _exprWidth;
              if ((pNVar13 == pNVar12) ||
                 (pNVar13 = SmallVectorBase<slang::ast::PortSymbol::NetTypeRange>::end
                                      ((SmallVectorBase<slang::ast::PortSymbol::NetTypeRange> *)
                                       local_f0), pNVar4 == pNVar13)) break;
              uStack_21c = right + uStack_21c;
            }
            pNVar13 = ex;
            pNVar12 = SmallVectorBase<slang::ast::PortSymbol::NetTypeRange>::end
                                ((SmallVectorBase<slang::ast::PortSymbol::NetTypeRange> *)local_68);
            pNVar4 = _exprWidth;
            if ((pNVar13 != pNVar12) ||
               (pNVar13 = SmallVectorBase<slang::ast::PortSymbol::NetTypeRange>::end
                                    ((SmallVectorBase<slang::ast::PortSymbol::NetTypeRange> *)
                                     local_f0), pNVar4 != pNVar13)) {
              assert::assertFailed
                        ("in == internal.end() && ex == external.end()",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/symbols/PortSymbols.cpp"
                         ,0x7de,"void slang::ast::PortConnection::checkSimulatedNetTypes() const");
            }
            scope._4_4_ = 0;
          }
        }
      }
    }
LAB_002fbaf5:
    SmallVector<slang::ast::PortSymbol::NetTypeRange,_4UL>::~SmallVector
              ((SmallVector<slang::ast::PortSymbol::NetTypeRange,_4UL> *)local_f0);
    SmallVector<slang::ast::PortSymbol::NetTypeRange,_4UL>::~SmallVector
              ((SmallVector<slang::ast::PortSymbol::NetTypeRange,_4UL> *)local_68);
  }
  return;
}

Assistant:

void PortConnection::checkSimulatedNetTypes() const {
    getExpression();
    if (!expr || expr->bad())
        return;

    SmallVector<PortSymbol::NetTypeRange, 4> internal;
    if (port.kind == SymbolKind::Port)
        port.as<PortSymbol>().getNetTypes(internal);
    else {
        for (auto p : port.as<MultiPortSymbol>().ports)
            p->getNetTypes(internal);
    }

    SmallVector<PortSymbol::NetTypeRange, 4> external;
    getNetRanges(*expr, external);

    // There might not be any nets, in which case we should just leave.
    if (internal.empty() && external.empty())
        return;

    auto scope = parentInstance.getParentScope();
    ASSERT(scope);

    // Do additional checking on the expression for interconnect port connections.
    if (internal.size() == 1 && internal[0].netType->netKind == NetType::Interconnect) {
        if (auto sym = findAnyVars(*expr)) {
            scope->addDiag(diag::InterconnectPortVar, expr->sourceRange) << sym->name;
            return;
        }
    }

    auto requireMatching = [&](const NetType& udnt) {
        // Types are more restricted; they must match instead of just being
        // assignment compatible. Also direction must be input or output.
        // We need to do this dance to get at the type of the connection prior
        // to it being converted to match the type of the port.
        auto exprType = expr->type.get();
        if (expr->kind == ExpressionKind::Conversion) {
            auto& conv = expr->as<ConversionExpression>();
            if (conv.isImplicit())
                exprType = conv.operand().type;
        }
        else if (expr->kind == ExpressionKind::Assignment) {
            auto& assign = expr->as<AssignmentExpression>();
            if (assign.isLValueArg())
                exprType = assign.left().type;
        }

        auto [direction, type] = getDirAndType(port);
        if (!type->isMatching(*exprType)) {
            // If this is from an interconnect connection, don't require matching types.
            auto isInterconnect = [](const Type& t) {
                auto curr = &t;
                while (curr->isArray())
                    curr = curr->getArrayElementType();

                return curr->isUntypedType();
            };

            if (isInterconnect(*type) || isInterconnect(*exprType))
                return;

            auto& diag = scope->addDiag(diag::MismatchedUserDefPortConn, expr->sourceRange);
            diag << udnt.name;
            diag << *type;
            diag << *exprType;
        }
        else if (direction != ArgumentDirection::In && direction != ArgumentDirection::Out) {
            auto& diag = scope->addDiag(diag::MismatchedUserDefPortDir, expr->sourceRange);
            diag << udnt.name;
        }
    };

    // If only one side has net types, check for user-defined nettypes,
    // which impose additional restrictions on the connection.
    if (internal.empty() || external.empty()) {
        const NetType* udnt = nullptr;
        auto checker = [&](auto& list) {
            for (auto& ntr : list) {
                if (!ntr.netType->isBuiltIn()) {
                    udnt = ntr.netType;
                    break;
                }
            }
        };

        checker(internal);
        checker(external);
        if (udnt)
            requireMatching(*udnt);

        return;
    }

    // Simple case is one net connected on each side.
    if (internal.size() == 1 && external.size() == 1) {
        auto& inNt = *internal[0].netType;
        auto& exNt = *external[0].netType;
        if (&inNt == &exNt)
            return;

        if (!inNt.isBuiltIn() || !exNt.isBuiltIn()) {
            // If both sides are user-defined nettypes they need to match.
            if (!inNt.isBuiltIn() && !exNt.isBuiltIn()) {
                auto& diag = scope->addDiag(diag::UserDefPortTwoSided, expr->sourceRange);
                diag << inNt.name << exNt.name;
            }
            else if (!inNt.isBuiltIn()) {
                requireMatching(inNt);
            }
            else {
                requireMatching(exNt);
            }
        }
        else {
            // Otherwise both sides are built-in nettypes.
            bool shouldWarn;
            NetType::getSimulatedNetType(inNt, exNt, shouldWarn);
            if (shouldWarn) {
                auto& diag = scope->addDiag(diag::NetInconsistent, expr->sourceRange);
                diag << exNt.name;
                diag << inNt.name;
                diag.addNote(diag::NoteDeclarationHere, port.location);
            }
        }

        return;
    }

    // Otherwise we need to compare ranges of net types for differences.
    auto in = internal.begin();
    auto ex = external.begin();
    bitwidth_t currBit = 0;
    bitwidth_t exprWidth = expr->type->getBitWidth();
    bool shownDeclaredHere = false;

    while (true) {
        bool shouldWarn;
        auto& inNt = *in->netType;
        auto& exNt = *ex->netType;

        if (!inNt.isBuiltIn() || !exNt.isBuiltIn()) {
            if (&inNt != &exNt) {
                scope->addDiag(diag::UserDefPortMixedConcat, expr->sourceRange)
                    << inNt.name << exNt.name;
                return;
            }
            shouldWarn = false;
        }
        else {
            NetType::getSimulatedNetType(inNt, exNt, shouldWarn);
        }

        bitwidth_t width;
        if (in->width < ex->width) {
            width = in->width;
            ex->width -= width;
            in++;
        }
        else {
            width = ex->width;
            ex++;

            if (in->width == width)
                in++;
            else
                in->width -= width;
        }

        if (shouldWarn) {
            ASSERT(exprWidth >= currBit + width);
            bitwidth_t left = exprWidth - currBit - 1;
            bitwidth_t right = left - (width - 1);

            auto& diag = scope->addDiag(diag::NetRangeInconsistent, expr->sourceRange);
            diag << exNt.name;
            diag << left << right;
            diag << inNt.name;

            if (!shownDeclaredHere) {
                diag.addNote(diag::NoteDeclarationHere, port.location);
                shownDeclaredHere = true;
            }
        }

        if (in == internal.end() || ex == external.end()) {
            ASSERT(in == internal.end() && ex == external.end());
            break;
        }

        currBit += width;
    }
}